

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set.c
# Opt level: O0

void sysbvm_identitySet_insert(sysbvm_context_t *context,sysbvm_tuple_t set,sysbvm_tuple_t element)

{
  long lVar1;
  _Bool _Var2;
  size_t sVar3;
  sysbvm_size_t sVar4;
  sysbvm_tuple_t sVar5;
  size_t capacityThreshold;
  size_t newSize;
  size_t capacity;
  _Bool isNewElement;
  sysbvm_array_t *storage;
  sysbvm_identitySet_t *setObject;
  intptr_t elementIndex;
  sysbvm_tuple_t element_local;
  sysbvm_tuple_t set_local;
  sysbvm_context_t *context_local;
  
  if ((element != 0x3f) && (_Var2 = sysbvm_tuple_isNonNullPointer(set), _Var2)) {
    setObject = (sysbvm_identitySet_t *)sysbvm_identitySet_scanFor(set,element);
    if ((long)setObject < 0) {
      sysbvm_identitySet_increaseCapacity(context,set);
      setObject = (sysbvm_identitySet_t *)sysbvm_identitySet_scanFor(set,element);
      if ((long)setObject < 0) {
        sysbvm_error("Set out of memory.");
      }
    }
    lVar1 = *(long *)(*(long *)(set + 0x18) + 0x10 + (long)setObject * 8);
    *(sysbvm_tuple_t *)(*(long *)(set + 0x18) + 0x10 + (long)setObject * 8) = element;
    if (lVar1 == 0x3f) {
      sVar3 = sysbvm_tuple_getSizeInSlots(*(sysbvm_tuple_t *)(set + 0x18));
      sVar4 = sysbvm_tuple_size_decode(*(sysbvm_tuple_t *)(set + 0x10));
      sVar5 = sysbvm_tuple_size_encode(context,sVar4 + 1);
      *(sysbvm_tuple_t *)(set + 0x10) = sVar5;
      if (sVar3 * 3 >> 2 <= sVar4 + 1) {
        sysbvm_identitySet_increaseCapacity(context,set);
      }
    }
  }
  return;
}

Assistant:

SYSBVM_API void sysbvm_identitySet_insert(sysbvm_context_t *context, sysbvm_tuple_t set, sysbvm_tuple_t element)
{
    if(element == SYSBVM_HASHTABLE_EMPTY_ELEMENT_TUPLE)
        return;

    if(!sysbvm_tuple_isNonNullPointer(set))
        return;

    intptr_t elementIndex = sysbvm_identitySet_scanFor(set, element);
    if(elementIndex < 0)
    {
        sysbvm_identitySet_increaseCapacity(context, set);
        elementIndex = sysbvm_identitySet_scanFor(set, element);
        if(elementIndex < 0)
            sysbvm_error("Set out of memory.");
    }

    sysbvm_identitySet_t *setObject = (sysbvm_identitySet_t*)set;
    sysbvm_array_t *storage = (sysbvm_array_t*)setObject->storage;
    bool isNewElement = storage->elements[elementIndex] == SYSBVM_HASHTABLE_EMPTY_ELEMENT_TUPLE;
    storage->elements[elementIndex] = element;

    // Count the newly inserted element.
    if(isNewElement)
    {
        size_t capacity = sysbvm_tuple_getSizeInSlots(setObject->storage);
        size_t newSize = sysbvm_tuple_size_decode(setObject->size) + 1;
        setObject->size = sysbvm_tuple_size_encode(context, newSize);
        size_t capacityThreshold = capacity * 3 / 4;

        // Make sure the maximum occupancy rate is not greater than 80%.
        if(newSize >= capacityThreshold)
            sysbvm_identitySet_increaseCapacity(context, set);
    }
}